

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::Material>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Material *material,string *prop_name,Property *out_prop)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ListEditQual LVar2;
  const_iterator cVar3;
  undefined8 uVar4;
  pointer pcVar5;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX;
  pointer extraout_RAX_00;
  Attribute attr;
  undefined1 local_8b8 [40];
  _Alloc_hider local_890;
  size_type local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  storage_union local_870;
  vtable_type *local_860;
  bool local_858;
  undefined1 local_850 [32];
  undefined1 local_830 [24];
  AttrMetas AStack_818;
  Property local_610;
  
  if (out_prop == (Property *)0x0) {
    local_610._attrib._name._M_dataplus._M_p =
         "[InternalError] nullptr in output Property is not allowed.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_610);
    return extraout_RAX;
  }
  cVar3._M_node = (_Base_ptr)::std::__cxx11::string::compare((char *)prop_name);
  if ((int)cVar3._M_node == 0) {
    if ((material->surface)._authored != true) goto LAB_004cda1e;
    local_8b8._0_8_ = local_8b8 + 0x10;
    local_8b8._8_8_ = 0;
    local_8b8[0x10] = '\0';
    local_8b8._32_4_ = Varying;
    local_8b8[0x24] = false;
    local_890._M_p = (pointer)&local_880;
    local_888 = 0;
    local_880._M_local_buf[0] = '\0';
    local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_870.dynamic = (void *)0x0;
    local_858 = false;
    local_850._0_8_ = (pointer)0x0;
    local_850[8] = 0;
    local_850._9_7_ = 0;
    local_850[0x10] = 0;
    local_850._17_8_ = 0;
    AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
    AStack_818.elementSize.has_value_ = false;
    AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
    AStack_818.hidden.has_value_ = false;
    AStack_818.hidden.contained = (storage_t<bool>)0x0;
    AStack_818.comment.has_value_ = false;
    AStack_818.weight.contained = (storage_t<double>)0x0;
    AStack_818.connectability.has_value_ = false;
    AStack_818.bindMaterialAs.contained._16_8_ = 0;
    AStack_818.bindMaterialAs.contained._24_8_ = 0;
    AStack_818.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.bindMaterialAs.contained._8_8_ = 0;
    AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
    AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.comment.contained._8_8_ = 0;
    AStack_818.comment.contained._16_8_ = 0;
    AStack_818.comment.contained._24_8_ = 0;
    AStack_818.comment.contained._32_8_ = 0;
    AStack_818.comment.contained._40_8_ = 0;
    AStack_818.customData.has_value_ = false;
    AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.customData.contained._8_8_ = 0;
    AStack_818.customData.contained._16_8_ = 0;
    AStack_818.customData.contained._24_8_ = 0;
    AStack_818.customData.contained._32_8_ = 0;
    AStack_818.customData.contained._40_8_ = 0;
    AStack_818.weight.has_value_ = false;
    AStack_818.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.connectability.contained._8_8_ = 0;
    AStack_818.connectability.contained._16_8_ = 0;
    AStack_818.connectability.contained._24_8_ = 0;
    AStack_818.outputName.has_value_ = false;
    AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.outputName.contained._8_8_ = 0;
    AStack_818.outputName.contained._16_8_ = 0;
    AStack_818.outputName.contained._24_8_ = 0;
    AStack_818.renderType.has_value_ = false;
    AStack_818.sdrMetadata.has_value_ = false;
    AStack_818.renderType.contained._16_8_ = 0;
    AStack_818.renderType.contained._24_8_ = 0;
    AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.renderType.contained._8_8_ = 0;
    AStack_818.displayName.has_value_ = false;
    AStack_818.sdrMetadata.contained._32_8_ = 0;
    AStack_818.sdrMetadata.contained._40_8_ = 0;
    AStack_818.sdrMetadata.contained._16_8_ = 0;
    AStack_818.sdrMetadata.contained._24_8_ = 0;
    AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.sdrMetadata.contained._8_8_ = 0;
    AStack_818.displayGroup.has_value_ = false;
    AStack_818.displayName.contained._16_8_ = 0;
    AStack_818.displayName.contained._24_8_ = 0;
    AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.displayName.contained._8_8_ = 0;
    AStack_818.bindMaterialAs.has_value_ = false;
    AStack_818.displayGroup.contained._16_8_ = 0;
    AStack_818.displayGroup.contained._24_8_ = 0;
    AStack_818.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    AStack_818.displayGroup.contained._8_8_ = 0;
    local_830[0x10] = 0;
    stack0xfffffffffffff7e1 = 0;
    local_830._0_8_ = (pointer)0x0;
    local_830[8] = 0;
    local_830._9_7_ = 0;
    AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    AStack_818.stringData.
    super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    AStack_818.stringData.
    super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    AStack_818.stringData.
    super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &local_610._attrib._name.field_2;
    local_610._attrib._name.field_2._M_allocated_capacity._0_4_ = 0x656b6f74;
    local_610._attrib._name.field_2._M_allocated_capacity._4_2_ = 0x6e;
    local_610._attrib._name._M_string_length = 5;
    AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_610._attrib._name._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_assign((string *)&local_890);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._attrib._name._M_dataplus._M_p != paVar1) {
      operator_delete(local_610._attrib._name._M_dataplus._M_p,
                      CONCAT26(local_610._attrib._name.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_610._attrib._name.field_2._M_allocated_capacity._4_2_,
                                        local_610._attrib._name.field_2._M_allocated_capacity._0_4_)
                              ) + 1);
    }
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&material->surface);
    AttrMetas::operator=(&AStack_818,&(material->surface)._metas);
    Property::Property(&local_610,(Attribute *)local_8b8,false);
    Property::operator=(out_prop,&local_610);
    Property::~Property(&local_610);
    LVar2 = (material->surface)._listOpQual;
  }
  else {
    cVar3._M_node = (_Base_ptr)::std::__cxx11::string::compare((char *)prop_name);
    if ((int)cVar3._M_node == 0) {
      if ((material->displacement)._authored != true) goto LAB_004cda1e;
      local_8b8._0_8_ = local_8b8 + 0x10;
      local_8b8._8_8_ = 0;
      local_8b8[0x10] = '\0';
      local_8b8._32_4_ = Varying;
      local_8b8[0x24] = false;
      local_890._M_p = (pointer)&local_880;
      local_888 = 0;
      local_880._M_local_buf[0] = '\0';
      local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_870.dynamic = (void *)0x0;
      local_858 = false;
      local_850._0_8_ = (pointer)0x0;
      local_850[8] = 0;
      local_850._9_7_ = 0;
      local_850[0x10] = 0;
      local_850._17_8_ = 0;
      AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
      AStack_818.elementSize.has_value_ = false;
      AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
      AStack_818.hidden.has_value_ = false;
      AStack_818.hidden.contained = (storage_t<bool>)0x0;
      AStack_818.comment.has_value_ = false;
      AStack_818.weight.contained = (storage_t<double>)0x0;
      AStack_818.connectability.has_value_ = false;
      AStack_818.bindMaterialAs.contained._16_8_ = 0;
      AStack_818.bindMaterialAs.contained._24_8_ = 0;
      AStack_818.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.bindMaterialAs.contained._8_8_ = 0;
      AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
      AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.comment.contained._8_8_ = 0;
      AStack_818.comment.contained._16_8_ = 0;
      AStack_818.comment.contained._24_8_ = 0;
      AStack_818.comment.contained._32_8_ = 0;
      AStack_818.comment.contained._40_8_ = 0;
      AStack_818.customData.has_value_ = false;
      AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.customData.contained._8_8_ = 0;
      AStack_818.customData.contained._16_8_ = 0;
      AStack_818.customData.contained._24_8_ = 0;
      AStack_818.customData.contained._32_8_ = 0;
      AStack_818.customData.contained._40_8_ = 0;
      AStack_818.weight.has_value_ = false;
      AStack_818.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.connectability.contained._8_8_ = 0;
      AStack_818.connectability.contained._16_8_ = 0;
      AStack_818.connectability.contained._24_8_ = 0;
      AStack_818.outputName.has_value_ = false;
      AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.outputName.contained._8_8_ = 0;
      AStack_818.outputName.contained._16_8_ = 0;
      AStack_818.outputName.contained._24_8_ = 0;
      AStack_818.renderType.has_value_ = false;
      AStack_818.sdrMetadata.has_value_ = false;
      AStack_818.renderType.contained._16_8_ = 0;
      AStack_818.renderType.contained._24_8_ = 0;
      AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.renderType.contained._8_8_ = 0;
      AStack_818.displayName.has_value_ = false;
      AStack_818.sdrMetadata.contained._32_8_ = 0;
      AStack_818.sdrMetadata.contained._40_8_ = 0;
      AStack_818.sdrMetadata.contained._16_8_ = 0;
      AStack_818.sdrMetadata.contained._24_8_ = 0;
      AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.sdrMetadata.contained._8_8_ = 0;
      AStack_818.displayGroup.has_value_ = false;
      AStack_818.displayName.contained._16_8_ = 0;
      AStack_818.displayName.contained._24_8_ = 0;
      AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.displayName.contained._8_8_ = 0;
      AStack_818.bindMaterialAs.has_value_ = false;
      AStack_818.displayGroup.contained._16_8_ = 0;
      AStack_818.displayGroup.contained._24_8_ = 0;
      AStack_818.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.displayGroup.contained._8_8_ = 0;
      local_830[0x10] = 0;
      stack0xfffffffffffff7e1 = 0;
      local_830._0_8_ = (pointer)0x0;
      local_830[8] = 0;
      local_830._9_7_ = 0;
      AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      AStack_818.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      AStack_818.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      AStack_818.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar1 = &local_610._attrib._name.field_2;
      local_610._attrib._name.field_2._M_allocated_capacity._0_4_ = 0x656b6f74;
      local_610._attrib._name.field_2._M_allocated_capacity._4_2_ = 0x6e;
      local_610._attrib._name._M_string_length = 5;
      AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_610._attrib._name._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_assign((string *)&local_890);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610._attrib._name._M_dataplus._M_p != paVar1) {
        operator_delete(local_610._attrib._name._M_dataplus._M_p,
                        CONCAT26(local_610._attrib._name.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_610._attrib._name.field_2._M_allocated_capacity.
                                          _4_2_,local_610._attrib._name.field_2.
                                                _M_allocated_capacity._0_4_)) + 1);
      }
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&material->displacement)
      ;
      AttrMetas::operator=(&AStack_818,&(material->displacement)._metas);
      Property::Property(&local_610,(Attribute *)local_8b8,false);
      Property::operator=(out_prop,&local_610);
      Property::~Property(&local_610);
      LVar2 = (material->displacement)._listOpQual;
    }
    else {
      cVar3._M_node = (_Base_ptr)::std::__cxx11::string::compare((char *)prop_name);
      if ((int)cVar3._M_node != 0) {
        cVar3 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                ::find(&(material->super_UsdShadePrim).props._M_t,prop_name);
        if ((_Rb_tree_header *)cVar3._M_node ==
            &(material->super_UsdShadePrim).props._M_t._M_impl.super__Rb_tree_header) {
LAB_004cda1e:
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value = true;
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_value = false;
          return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)cVar3._M_node;
        }
        ::std::__cxx11::string::_M_assign((string *)out_prop);
        (out_prop->_attrib)._varying_authored = (bool)cVar3._M_node[3].field_0x4;
        (out_prop->_attrib)._variability = cVar3._M_node[3]._M_color;
        ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
        linb::any::operator=((any *)&(out_prop->_attrib)._var,(any *)&cVar3._M_node[4]._M_parent);
        (out_prop->_attrib)._var._blocked = SUB41(cVar3._M_node[5]._M_color,0);
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&(out_prop->_attrib)._var._ts,
                    (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&cVar3._M_node[5]._M_parent);
        (out_prop->_attrib)._var._ts._dirty = SUB41(cVar3._M_node[6]._M_color,0);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&(out_prop->_attrib)._paths,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &cVar3._M_node[6]._M_parent);
        AttrMetas::operator=(&(out_prop->_attrib)._metas,(AttrMetas *)(cVar3._M_node + 7));
        *(_Base_ptr *)&out_prop->_listOpQual = cVar3._M_node[0x17]._M_parent;
        (out_prop->_rel).type = *(Type *)&cVar3._M_node[0x17]._M_left;
        Path::operator=(&(out_prop->_rel).targetPath,(Path *)&cVar3._M_node[0x17]._M_right);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&(out_prop->_rel).targetPathVector,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &cVar3._M_node[0x1e]._M_parent);
        (out_prop->_rel).listOpQual = cVar3._M_node[0x1f]._M_color;
        AttrMetas::operator=(&(out_prop->_rel)._metas,(AttrMetas *)&cVar3._M_node[0x1f]._M_parent);
        (out_prop->_rel)._varying_authored = *(bool *)&cVar3._M_node[0x2f]._M_left;
        uVar4 = ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
        pcVar5 = (pointer)CONCAT71((int7)((ulong)uVar4 >> 8),*(bool *)&cVar3._M_node[0x30]._M_right)
        ;
        out_prop->_has_custom = *(bool *)&cVar3._M_node[0x30]._M_right;
        goto LAB_004cda15;
      }
      if ((material->volume)._authored != true) goto LAB_004cda1e;
      local_8b8._0_8_ = local_8b8 + 0x10;
      local_8b8._8_8_ = 0;
      local_8b8[0x10] = '\0';
      local_8b8._32_4_ = Varying;
      local_8b8[0x24] = false;
      local_890._M_p = (pointer)&local_880;
      local_888 = 0;
      local_880._M_local_buf[0] = '\0';
      local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_870.dynamic = (void *)0x0;
      local_858 = false;
      local_850._0_8_ = (pointer)0x0;
      local_850[8] = 0;
      local_850._9_7_ = 0;
      local_850[0x10] = 0;
      local_850._17_8_ = 0;
      AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
      AStack_818.elementSize.has_value_ = false;
      AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
      AStack_818.hidden.has_value_ = false;
      AStack_818.hidden.contained = (storage_t<bool>)0x0;
      AStack_818.comment.has_value_ = false;
      AStack_818.weight.contained = (storage_t<double>)0x0;
      AStack_818.connectability.has_value_ = false;
      AStack_818.bindMaterialAs.contained._16_8_ = 0;
      AStack_818.bindMaterialAs.contained._24_8_ = 0;
      AStack_818.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.bindMaterialAs.contained._8_8_ = 0;
      AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
      AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.comment.contained._8_8_ = 0;
      AStack_818.comment.contained._16_8_ = 0;
      AStack_818.comment.contained._24_8_ = 0;
      AStack_818.comment.contained._32_8_ = 0;
      AStack_818.comment.contained._40_8_ = 0;
      AStack_818.customData.has_value_ = false;
      AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.customData.contained._8_8_ = 0;
      AStack_818.customData.contained._16_8_ = 0;
      AStack_818.customData.contained._24_8_ = 0;
      AStack_818.customData.contained._32_8_ = 0;
      AStack_818.customData.contained._40_8_ = 0;
      AStack_818.weight.has_value_ = false;
      AStack_818.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.connectability.contained._8_8_ = 0;
      AStack_818.connectability.contained._16_8_ = 0;
      AStack_818.connectability.contained._24_8_ = 0;
      AStack_818.outputName.has_value_ = false;
      AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.outputName.contained._8_8_ = 0;
      AStack_818.outputName.contained._16_8_ = 0;
      AStack_818.outputName.contained._24_8_ = 0;
      AStack_818.renderType.has_value_ = false;
      AStack_818.sdrMetadata.has_value_ = false;
      AStack_818.renderType.contained._16_8_ = 0;
      AStack_818.renderType.contained._24_8_ = 0;
      AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.renderType.contained._8_8_ = 0;
      AStack_818.displayName.has_value_ = false;
      AStack_818.sdrMetadata.contained._32_8_ = 0;
      AStack_818.sdrMetadata.contained._40_8_ = 0;
      AStack_818.sdrMetadata.contained._16_8_ = 0;
      AStack_818.sdrMetadata.contained._24_8_ = 0;
      AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.sdrMetadata.contained._8_8_ = 0;
      AStack_818.displayGroup.has_value_ = false;
      AStack_818.displayName.contained._16_8_ = 0;
      AStack_818.displayName.contained._24_8_ = 0;
      AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.displayName.contained._8_8_ = 0;
      AStack_818.bindMaterialAs.has_value_ = false;
      AStack_818.displayGroup.contained._16_8_ = 0;
      AStack_818.displayGroup.contained._24_8_ = 0;
      AStack_818.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_818.displayGroup.contained._8_8_ = 0;
      local_830[0x10] = 0;
      stack0xfffffffffffff7e1 = 0;
      local_830._0_8_ = (pointer)0x0;
      local_830[8] = 0;
      local_830._9_7_ = 0;
      AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      AStack_818.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      AStack_818.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      AStack_818.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar1 = &local_610._attrib._name.field_2;
      local_610._attrib._name.field_2._M_allocated_capacity._0_4_ = 0x656b6f74;
      local_610._attrib._name.field_2._M_allocated_capacity._4_2_ = 0x6e;
      local_610._attrib._name._M_string_length = 5;
      AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_610._attrib._name._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_assign((string *)&local_890);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610._attrib._name._M_dataplus._M_p != paVar1) {
        operator_delete(local_610._attrib._name._M_dataplus._M_p,
                        CONCAT26(local_610._attrib._name.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_610._attrib._name.field_2._M_allocated_capacity.
                                          _4_2_,local_610._attrib._name.field_2.
                                                _M_allocated_capacity._0_4_)) + 1);
      }
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&material->volume);
      AttrMetas::operator=(&AStack_818,&(material->volume)._metas);
      Property::Property(&local_610,(Attribute *)local_8b8,false);
      Property::operator=(out_prop,&local_610);
      Property::~Property(&local_610);
      LVar2 = (material->volume)._listOpQual;
    }
  }
  out_prop->_listOpQual = LVar2;
  AttrMetas::~AttrMetas(&AStack_818);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_850);
  if (local_860 != (vtable_type *)0x0) {
    (*local_860->destroy)(&local_870);
    local_860 = (vtable_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_p != &local_880) {
    operator_delete(local_890._M_p,
                    CONCAT71(local_880._M_allocated_capacity._1_7_,local_880._M_local_buf[0]) + 1);
  }
  pcVar5 = local_8b8 + 0x10;
  if ((pointer)local_8b8._0_8_ != pcVar5) {
    operator_delete((void *)local_8b8._0_8_,CONCAT71(local_8b8._17_7_,local_8b8[0x10]) + 1);
    pcVar5 = extraout_RAX_00;
  }
LAB_004cda15:
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value = true;
  return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)CONCAT71((int7)((ulong)pcVar5 >> 8),1);
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const Material &material, const std::string &prop_name,
    Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  DCOUT("prop_name = " << prop_name);
  if (prop_name == "outputs:surface") {
    if (material.surface.authored()) {
      Attribute attr;
      attr.set_type_name(value::TypeTraits<value::token>::type_name());
      attr.set_connections(material.surface.get_connections());
      attr.metas() = material.surface.metas();
      (*out_prop) = Property(attr, /* custom */ false);
      out_prop->set_listedit_qual(material.surface.get_listedit_qual());
    } else {
      // Not authored
      return false;
    }
  } else if (prop_name == "outputs:displacement") {
    if (material.displacement.authored()) {
      Attribute attr;
      attr.set_type_name(value::TypeTraits<value::token>::type_name());
      attr.set_connections(material.displacement.get_connections());
      attr.metas() = material.displacement.metas();
      (*out_prop) = Property(attr, /* custom */ false);
      out_prop->set_listedit_qual(material.displacement.get_listedit_qual());
    } else {
      // Not authored
      return false;
    }
  } else if (prop_name == "outputs:volume") {
    if (material.volume.authored()) {
      Attribute attr;
      attr.set_type_name(value::TypeTraits<value::token>::type_name());
      attr.set_connections(material.volume.get_connections());
      attr.metas() = material.volume.metas();
      (*out_prop) = Property(attr, /* custom */ false);
      out_prop->set_listedit_qual(material.volume.get_listedit_qual());
    } else {
      // Not authored
      return false;
    }
  } else {
    const auto it = material.props.find(prop_name);
    if (it == material.props.end()) {
      // Attribute not found.
      return false;
    }

    (*out_prop) = it->second;
  }

  DCOUT("Prop found: " << prop_name
                       << ", ty = " << out_prop->value_type_name());
  return true;
}